

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CropResizeLayerParams::ByteSizeLong(CropResizeLayerParams *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  float fVar5;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  CropResizeLayerParams *this_local;
  
  data_size = 0;
  sVar3 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->targetsize_);
  if (sVar3 != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar3);
    data_size = sVar4 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar3);
  this->_targetsize_cached_byte_size_ = iVar2;
  data_size = sVar3 + data_size;
  bVar1 = has_mode(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SamplingMode>(this->mode_);
    data_size = sVar3 + 1 + data_size;
  }
  bVar1 = has_boxindicesmode(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::BoxCoordinatesMode>(this->boxindicesmode_);
    data_size = sVar3 + 1 + data_size;
  }
  bVar1 = normalizedcoordinates(this);
  if (bVar1) {
    data_size = data_size + 2;
  }
  fVar5 = spatialscale(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    data_size = data_size + 5;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t CropResizeLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CropResizeLayerParams)
  size_t total_size = 0;

  // repeated uint64 targetSize = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->targetsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _targetsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.SamplingMode mode = 3;
  if (this->has_mode()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->mode_);
  }

  // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
  if (this->has_boxindicesmode()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->boxindicesmode_);
  }

  // bool normalizedCoordinates = 2;
  if (this->normalizedcoordinates() != 0) {
    total_size += 1 + 1;
  }

  // float spatialScale = 5;
  if (this->spatialscale() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}